

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type>::
set<std::vector<wasm::Type,std::allocator<wasm::Type>>>
          (ArenaVectorBase<ArenaVector<wasm::Type>,wasm::Type> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *list)

{
  pointer pTVar1;
  pointer pTVar2;
  uintptr_t *puVar3;
  ulong size;
  
  pTVar1 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar2 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  size = (long)pTVar2 - (long)pTVar1 >> 3;
  if (*(ulong *)(this + 0x10) < size) {
    ArenaVector<wasm::Type>::allocate((ArenaVector<wasm::Type> *)this,size);
    pTVar1 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar2 = (list->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  puVar3 = *(uintptr_t **)this;
  for (; pTVar1 != pTVar2; pTVar1 = pTVar1 + 1) {
    *puVar3 = pTVar1->id;
    puVar3 = puVar3 + 1;
  }
  *(ulong *)(this + 8) = size;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }